

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O1

void __thiscall
soplex::SPxSolverBase<double>::setEnterBound4Row(SPxSolverBase<double> *this,int i,int n)

{
  double dVar1;
  Status SVar2;
  double *pdVar3;
  undefined8 *puVar4;
  long lVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  
  SVar2 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data[n];
  if (SVar2 == P_FIXED) {
    ::soplex::infinity::__tls_init();
    pdVar3 = (double *)__tls_get_addr(&PTR_003b6b60);
    dVar1 = *pdVar3;
    uVar6 = SUB84(dVar1,0);
    uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
    (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[i] = -dVar1;
    lVar5 = 0x670;
    ::soplex::infinity::__tls_init();
  }
  else {
    if (SVar2 == P_ON_UPPER) {
      (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[i] =
           (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[n];
      ::soplex::infinity::__tls_init();
      puVar4 = (undefined8 *)__tls_get_addr(&PTR_003b6b60);
      uVar6 = (undefined4)*puVar4;
      uVar7 = (undefined4)((ulong)*puVar4 >> 0x20);
    }
    else {
      if (SVar2 != P_ON_LOWER) {
        (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[i] =
             (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[n];
        dVar1 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[n];
        uVar6 = SUB84(dVar1,0);
        uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
        lVar5 = 0x688;
        goto LAB_001faf60;
      }
      ::soplex::infinity::__tls_init();
      pdVar3 = (double *)__tls_get_addr(&PTR_003b6b60);
      (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[i] = -*pdVar3;
      dVar1 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[n];
      uVar6 = SUB84(dVar1,0);
      uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    lVar5 = 0x670;
  }
LAB_001faf60:
  *(ulong *)(*(long *)((long)&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                              super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                              _vptr_ClassArray + lVar5) + (long)i * 8) = CONCAT44(uVar7,uVar6);
  return;
}

Assistant:

void SPxSolverBase<R>::setEnterBound4Row(int i, int n)
{
   assert(this->baseId(i).isSPxRowId());
   assert(this->number(SPxRowId(this->baseId(i))) == n);

   switch(this->desc().rowStatus(n))
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = theURbound[n];
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
      theLBbound[i] = theLRbound[n];
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_FIXED:
      theLBbound[i] = R(-infinity);
      theUBbound[i] = R(infinity);
      break;

   default:
      theUBbound[i] = theURbound[n];
      theLBbound[i] = theLRbound[n];
      break;
   }
}